

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  optional<bssl::Array<unsigned_char>_> *this;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t extraout_RDX;
  ptrdiff_t _Num;
  Span<const_unsigned_char> in;
  CBS child;
  CBS local_40;
  
  bVar1 = true;
  if ((contents != (CBS *)0x0) && (uVar2 = ssl_protocol_version(hs->ssl), 0x303 < uVar2)) {
    iVar3 = CBS_get_u16_length_prefixed(contents,&local_40);
    if ((iVar3 != 0) &&
       (in.size_ = extraout_RDX, in.data_ = (uchar *)local_40.len,
       bVar1 = ssl_is_valid_trust_anchor_list((bssl *)local_40.data,in), bVar1)) {
      this = &hs->peer_requested_trust_anchors;
      if ((hs->peer_requested_trust_anchors).
          super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
          super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
          super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true) {
        (hs->peer_requested_trust_anchors).
        super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
        super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
        super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged = false;
        Array<unsigned_char>::~Array((Array<unsigned_char> *)this);
      }
      (this->super__Optional_base<bssl::Array<unsigned_char>,_false,_false>)._M_payload.
      super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.data_ =
           (uchar *)0x0;
      (hs->peer_requested_trust_anchors).
      super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
      super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.size_ = 0;
      (hs->peer_requested_trust_anchors).
      super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
      super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged = true;
      bVar1 = Array<unsigned_char>::InitUninitialized((Array<unsigned_char> *)this,local_40.len);
      if ((uchar *)local_40.len != (uchar *)0x0 && bVar1) {
        memmove((this->super__Optional_base<bssl::Array<unsigned_char>,_false,_false>)._M_payload.
                super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.data_,
                local_40.data,local_40.len);
      }
      if (bVar1) {
        return true;
      }
      *out_alert = 'P';
      return false;
    }
    *out_alert = '2';
    bVar1 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xa6e);
  }
  return bVar1;
}

Assistant:

static bool ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,
                                                uint8_t *out_alert,
                                                CBS *contents) {
  if (contents == nullptr || ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    return true;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(contents, &child) ||
      !ssl_is_valid_trust_anchor_list(child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  hs->peer_requested_trust_anchors.emplace();
  if (!hs->peer_requested_trust_anchors->CopyFrom(child)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }
  return true;
}